

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_blend2.cpp
# Opt level: O1

void __thiscall Prog::Prog(Prog *this,Theme *theme,ALLEGRO_DISPLAY *display)

{
  undefined8 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  List *pLVar3;
  char *pcVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  int iVar6;
  Label *pLVar7;
  char *pcVar8;
  _Alloc_hider _Var9;
  char *__end_1;
  undefined1 *puVar10;
  ulong uVar11;
  char *__end;
  long lVar12;
  long lVar13;
  bool bVar14;
  List *images [3];
  long local_4e8;
  long local_4e0;
  long local_4d0;
  undefined1 local_4c8 [56];
  int local_490;
  undefined4 uStack_48c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_480;
  bool local_470;
  string local_468;
  string local_448;
  string local_428;
  string local_408;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  string local_388;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  Widget *local_1c8;
  List *local_1c0;
  List *local_1b8;
  List *local_1b0;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  List *local_48 [3];
  
  Dialog::Dialog(&this->d,theme,display,0x14,0x28);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"Memory","");
  Label::Label(&this->memory_label,&local_88,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"Texture","");
  Label::Label(&this->texture_label,&local_a8,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Source","");
  Label::Label(&this->source_label,&local_c8,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"Destination","");
  Label::Label(&this->destination_label,&local_e8,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  List::List(&this->source_image,0);
  local_1b0 = &this->destination_image;
  List::List(local_1b0,1);
  local_1c0 = &this->draw_mode;
  local_1b8 = &this->source_image;
  List::List(local_1c0,0);
  pLVar7 = (Label *)&this->field_0x2f0;
  lVar13 = 0;
  do {
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"","");
    Label::Label(pLVar7,&local_108,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    lVar13 = lVar13 + -0x60;
    pLVar7 = pLVar7 + 1;
  } while (lVar13 != -0x240);
  puVar10 = &this->field_0x510;
  lVar13 = 0;
  do {
    List::List((List *)(puVar10 + 0x20),0);
    lVar13 = lVar13 + -0x58;
    puVar10 = puVar10 + 0x58;
  } while (lVar13 != -0x210);
  pLVar7 = (Label *)&this->field_0x740;
  lVar13 = 0;
  local_1c8 = (Widget *)pLVar7;
  do {
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"","");
    Label::Label(pLVar7,&local_128,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    lVar13 = lVar13 + -0x60;
    pLVar7 = pLVar7 + 1;
  } while (lVar13 != -0x120);
  lVar13 = 0x860;
  do {
    HSlider::HSlider((HSlider *)((long)&(this->d).theme + lVar13),0,1);
    lVar13 = lVar13 + 0x40;
  } while (lVar13 != 0x920);
  lVar13 = 0x920;
  do {
    HSlider::HSlider((HSlider *)((long)&(this->d).theme + lVar13),0,1);
    lVar13 = lVar13 + 0x40;
  } while (lVar13 != 0x9e0);
  lVar13 = 0x9e0;
  do {
    HSlider::HSlider((HSlider *)((long)&(this->d).theme + lVar13),0,1);
    lVar13 = lVar13 + 0x40;
  } while (lVar13 != 0xaa0);
  lVar13 = 0xaa0;
  do {
    HSlider::HSlider((HSlider *)((long)&(this->d).theme + lVar13),0,1);
    lVar13 = lVar13 + 0x40;
  } while (lVar13 != 0xb60);
  Dialog::add(&this->d,&(this->memory_label).super_Widget,9,0,10,2);
  Dialog::add(&this->d,&(this->texture_label).super_Widget,0,0,10,2);
  Dialog::add(&this->d,&(this->source_label).super_Widget,1,0xf,6,2);
  Dialog::add(&this->d,&(this->destination_label).super_Widget,7,0xf,6,2);
  local_48[0] = local_1b8;
  local_48[1] = local_1b0;
  local_48[2] = local_1c0;
  iVar6 = 1;
  paVar2 = &local_68.field_2;
  lVar13 = 0;
  do {
    pLVar3 = local_48[lVar13];
    if (lVar13 == 2) {
      local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"original","");
      List::append_item(pLVar3,&local_268);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      }
      local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"scaled","");
      List::append_item(pLVar3,&local_288);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
      }
      local_68._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"rotated","");
      List::append_item(pLVar3,&local_68);
      paVar5 = paVar2;
      _Var9._M_p = local_68._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != paVar2) {
LAB_00106de2:
        operator_delete(_Var9._M_p,paVar5->_M_allocated_capacity + 1);
      }
    }
    else {
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"Mysha","");
      List::append_item(pLVar3,&local_1e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"Allegro","");
      List::append_item(pLVar3,&local_208);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"Mysha (tinted)","");
      List::append_item(pLVar3,&local_228);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"Allegro (tinted)","");
      List::append_item(pLVar3,&local_248);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
      local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"Color","");
      List::append_item(pLVar3,&local_1a8);
      paVar5 = &local_1a8.field_2;
      _Var9._M_p = local_1a8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != paVar5) goto LAB_00106de2;
    }
    Dialog::add(&this->d,&pLVar3->super_Widget,iVar6,0x10,4,6);
    lVar13 = lVar13 + 1;
    iVar6 = iVar6 + 6;
    if (lVar13 == 3) {
      iVar6 = 1;
      local_4d0 = 0x530;
      lVar13 = 0x2f8;
      local_4e0 = 0x328;
      local_4e8 = 0x2f0;
      uVar11 = 0;
      do {
        bVar14 = (uVar11 & 1) == 0;
        pcVar8 = "Alpha";
        if (bVar14) {
          pcVar8 = "Color";
        }
        local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
        pcVar4 = "Alpha";
        if (bVar14) {
          pcVar4 = "Color";
        }
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,pcVar8,pcVar4 + 5);
        Label::Label((Label *)local_4c8,&local_2a8,false);
        puVar1 = (undefined8 *)((long)&(this->d).grid_m + lVar13 + 1);
        *puVar1 = CONCAT17(local_4c8[0x28],local_4c8._33_7_);
        puVar1[1] = local_4c8._41_8_;
        puVar1 = (undefined8 *)((long)&(this->d).event_queue + lVar13);
        *puVar1 = local_4c8._24_8_;
        puVar1[1] = CONCAT71(local_4c8._33_7_,local_4c8[0x20]);
        puVar1 = (undefined8 *)((long)&(this->d).theme + lVar13);
        *puVar1 = local_4c8._8_8_;
        puVar1[1] = local_4c8._16_8_;
        std::__cxx11::string::operator=
                  ((string *)((long)&(this->d).theme + local_4e0),(string *)&local_490);
        *(bool *)((long)&(this->d).mouse_down_widget + lVar13) = local_470;
        local_4c8._0_8_ = &PTR__Label_0010f780;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(uStack_48c,local_490) != &local_480) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(uStack_48c,local_490),local_480._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
          operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
        }
        Dialog::add(&this->d,(Widget *)((long)&(this->d).theme + local_4e8),iVar6,0x17,3,2);
        local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"ONE","");
        pLVar3 = (List *)((long)&(this->d).theme + local_4d0);
        List::append_item(pLVar3,&local_2c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
          operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
        }
        local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"ZERO","");
        List::append_item(pLVar3,&local_2e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
          operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
        }
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"ALPHA","");
        List::append_item(pLVar3,&local_308);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._M_dataplus._M_p != &local_308.field_2) {
          operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
        }
        local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"INVERSE","");
        List::append_item(pLVar3,&local_328);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_dataplus._M_p != &local_328.field_2) {
          operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
        }
        local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"SRC_COLOR","");
        List::append_item(pLVar3,&local_348);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_348._M_dataplus._M_p != &local_348.field_2) {
          operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
        }
        local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"DEST_COLOR","");
        List::append_item(pLVar3,&local_368);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_368._M_dataplus._M_p != &local_368.field_2) {
          operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
        }
        local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"INV_SRC_COLOR","");
        List::append_item(pLVar3,&local_388);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_388._M_dataplus._M_p != &local_388.field_2) {
          operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
        }
        local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"INV_DEST_COLOR","");
        List::append_item(pLVar3,&local_3a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
          operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
        }
        local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"CONST_COLOR","");
        List::append_item(pLVar3,&local_3c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
          operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
        }
        local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"INV_CONST_COLOR","");
        List::append_item(pLVar3,&local_3e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
          operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
        }
        Dialog::add(&this->d,(Widget *)pLVar3,iVar6,0x18,3,10);
        uVar11 = uVar11 + 1;
        iVar6 = iVar6 + 3;
        local_4d0 = local_4d0 + 0x58;
        lVar13 = lVar13 + 0x60;
        local_4e0 = local_4e0 + 0x60;
        local_4e8 = local_4e8 + 0x60;
      } while (uVar11 != 4);
      lVar13 = 0x690;
      lVar12 = 0x478;
      local_4e0 = 0x4a8;
      local_4e8 = 0x470;
      iVar6 = 0xd;
      do {
        pcVar8 = "Alpha op";
        if (lVar13 == 0x690) {
          pcVar8 = "Blend op";
        }
        local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
        pcVar4 = "Alpha op";
        if (lVar13 == 0x690) {
          pcVar4 = "Blend op";
        }
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,pcVar8,pcVar4 + 8);
        Label::Label((Label *)local_4c8,&local_408,false);
        puVar1 = (undefined8 *)((long)&(this->d).grid_m + lVar12 + 1);
        *puVar1 = CONCAT17(local_4c8[0x28],local_4c8._33_7_);
        puVar1[1] = local_4c8._41_8_;
        puVar1 = (undefined8 *)((long)&(this->d).event_queue + lVar12);
        *puVar1 = local_4c8._24_8_;
        puVar1[1] = CONCAT71(local_4c8._33_7_,local_4c8[0x20]);
        puVar1 = (undefined8 *)((long)&(this->d).theme + lVar12);
        *puVar1 = local_4c8._8_8_;
        puVar1[1] = local_4c8._16_8_;
        std::__cxx11::string::operator=
                  ((string *)((long)&(this->d).theme + local_4e0),(string *)&local_490);
        *(bool *)((long)&(this->d).mouse_down_widget + lVar12) = local_470;
        local_4c8._0_8_ = &PTR__Label_0010f780;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(uStack_48c,local_490) != &local_480) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(uStack_48c,local_490),local_480._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_408._M_dataplus._M_p != &local_408.field_2) {
          operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
        }
        Dialog::add(&this->d,(Widget *)((long)&(this->d).theme + local_4e8),iVar6,0x17,3,2);
        local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"ADD","");
        pLVar3 = (List *)((long)&(this->d).theme + lVar13);
        List::append_item(pLVar3,&local_428);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_428._M_dataplus._M_p != &local_428.field_2) {
          operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
        }
        local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"SRC_MINUS_DEST","");
        List::append_item(pLVar3,&local_448);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_448._M_dataplus._M_p != &local_448.field_2) {
          operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
        }
        local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"DEST_MINUS_SRC","");
        List::append_item(pLVar3,&local_468);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_468._M_dataplus._M_p != &local_468.field_2) {
          operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
        }
        Dialog::add(&this->d,(Widget *)pLVar3,iVar6,0x18,3,6);
        lVar13 = lVar13 + 0x58;
        lVar12 = lVar12 + 0x60;
        local_4e0 = local_4e0 + 0x60;
        local_4e8 = local_4e8 + 0x60;
        iVar6 = iVar6 + 3;
      } while (lVar13 != 0x740);
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_148,"Source tint/color RGBA","");
      Label::Label((Label *)local_4c8,&local_148,true);
      *(ulong *)&this->field_0x761 = CONCAT17(local_4c8[0x28],local_4c8._33_7_);
      *(undefined8 *)&this->field_0x769 = local_4c8._41_8_;
      *(undefined8 *)&this->field_0x758 = local_4c8._24_8_;
      *(ulong *)&this->field_0x760 = CONCAT71(local_4c8._33_7_,local_4c8[0x20]);
      *(undefined8 *)&this->field_0x748 = local_4c8._8_8_;
      *(undefined8 *)&this->field_0x750 = local_4c8._16_8_;
      std::__cxx11::string::operator=((string *)&this->field_0x778,(string *)&local_490);
      this->field_0x798 = local_470;
      local_4c8._0_8_ = &PTR__Label_0010f780;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(uStack_48c,local_490) != &local_480) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(uStack_48c,local_490),local_480._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
      local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_168,"Dest tint/color RGBA","");
      Label::Label((Label *)local_4c8,&local_168,true);
      *(ulong *)&this->field_0x7c1 = CONCAT17(local_4c8[0x28],local_4c8._33_7_);
      *(undefined8 *)&this->field_0x7c9 = local_4c8._41_8_;
      *(undefined8 *)&this->field_0x7b8 = local_4c8._24_8_;
      *(ulong *)&this->field_0x7c0 = CONCAT71(local_4c8._33_7_,local_4c8[0x20]);
      *(undefined8 *)&this->field_0x7a8 = local_4c8._8_8_;
      *(undefined8 *)&this->field_0x7b0 = local_4c8._16_8_;
      std::__cxx11::string::operator=((string *)&this->field_0x7d8,(string *)&local_490);
      this->field_0x7f8 = local_470;
      local_4c8._0_8_ = &PTR__Label_0010f780;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(uStack_48c,local_490) != &local_480) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(uStack_48c,local_490),local_480._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
        operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
      }
      local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"Const color RGBA","");
      Label::Label((Label *)local_4c8,&local_188,true);
      *(ulong *)&this->field_0x821 = CONCAT17(local_4c8[0x28],local_4c8._33_7_);
      *(undefined8 *)&this->field_0x829 = local_4c8._41_8_;
      *(undefined8 *)&this->field_0x818 = local_4c8._24_8_;
      *(ulong *)&this->field_0x820 = CONCAT71(local_4c8._33_7_,local_4c8[0x20]);
      *(undefined8 *)&this->field_0x808 = local_4c8._8_8_;
      *(undefined8 *)&this->field_0x810 = local_4c8._16_8_;
      std::__cxx11::string::operator=((string *)&this->field_0x838,(string *)&local_490);
      this->field_0x858 = local_470;
      local_4c8._0_8_ = &PTR__Label_0010f780;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(uStack_48c,local_490) != &local_480) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(uStack_48c,local_490),local_480._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
      }
      Dialog::add(&this->d,local_1c8,1,0x22,5,1);
      Dialog::add(&this->d,(Widget *)&this->field_0x7a0,7,0x22,5,1);
      iVar6 = 1;
      Dialog::add(&this->d,(Widget *)&this->field_0x800,0xd,0x22,5,1);
      lVar13 = -0xc0;
      do {
        HSlider::HSlider((HSlider *)local_4c8,0xff,0xff);
        *(ulong *)(&this->field_0x941 + lVar13) = CONCAT17(local_4c8[0x28],local_4c8._33_7_);
        *(undefined8 *)((long)(&this->field_0x941 + lVar13) + 8) = local_4c8._41_8_;
        *(undefined8 *)(&this->field_0x938 + lVar13) = local_4c8._24_8_;
        *(ulong *)((long)(&this->field_0x938 + lVar13) + 8) =
             CONCAT71(local_4c8._33_7_,local_4c8[0x20]);
        *(undefined8 *)(&this->field_0x928 + lVar13) = local_4c8._8_8_;
        *(undefined8 *)((long)(&this->field_0x928 + lVar13) + 8) = local_4c8._16_8_;
        *(ulong *)(&this->field_0x954 + lVar13) = CONCAT44(local_490,local_4c8._52_4_);
        HSlider::HSlider((HSlider *)local_4c8,0xff,0xff);
        *(ulong *)(&this->field_0xa01 + lVar13) = CONCAT17(local_4c8[0x28],local_4c8._33_7_);
        *(undefined8 *)((long)(&this->field_0xa01 + lVar13) + 8) = local_4c8._41_8_;
        *(undefined8 *)(&this->field_0x9f8 + lVar13) = local_4c8._24_8_;
        *(ulong *)((long)(&this->field_0x9f8 + lVar13) + 8) =
             CONCAT71(local_4c8._33_7_,local_4c8[0x20]);
        *(undefined8 *)(&this->field_0x9e8 + lVar13) = local_4c8._8_8_;
        *(undefined8 *)((long)(&this->field_0x9e8 + lVar13) + 8) = local_4c8._16_8_;
        *(ulong *)(&this->field_0xa14 + lVar13) = CONCAT44(local_490,local_4c8._52_4_);
        HSlider::HSlider((HSlider *)local_4c8,0xff,0xff);
        *(ulong *)(&this->field_0xac1 + lVar13) = CONCAT17(local_4c8[0x28],local_4c8._33_7_);
        *(undefined8 *)((long)(&this->field_0xac1 + lVar13) + 8) = local_4c8._41_8_;
        *(undefined8 *)(&this->field_0xab8 + lVar13) = local_4c8._24_8_;
        *(ulong *)((long)(&this->field_0xab8 + lVar13) + 8) =
             CONCAT71(local_4c8._33_7_,local_4c8[0x20]);
        *(undefined8 *)(&this->field_0xaa8 + lVar13) = local_4c8._8_8_;
        *(undefined8 *)((long)(&this->field_0xaa8 + lVar13) + 8) = local_4c8._16_8_;
        *(ulong *)(&this->field_0xad4 + lVar13) = CONCAT44(local_490,local_4c8._52_4_);
        HSlider::HSlider((HSlider *)local_4c8,0xff,0xff);
        *(ulong *)((long)&this[1].d.x_padding + lVar13 + 1) =
             CONCAT17(local_4c8[0x28],local_4c8._33_7_);
        *(undefined8 *)(&this[1].d.quit_requested + lVar13) = local_4c8._41_8_;
        *(undefined8 *)((long)&this[1].d.grid_m + lVar13) = local_4c8._24_8_;
        *(ulong *)((long)&this[1].d.x_padding + lVar13) = CONCAT71(local_4c8._33_7_,local_4c8[0x20])
        ;
        *(undefined8 *)((long)&this[1].d.display + lVar13) = local_4c8._8_8_;
        *(undefined8 *)((long)&this[1].d.event_queue + lVar13) = local_4c8._16_8_;
        *(ulong *)((long)&this[1].d.all_widgets.
                          super__List_base<Widget_*,_std::allocator<Widget_*>_>._M_impl._M_node.
                          super__List_node_base._M_next + lVar13 + 4) =
             CONCAT44(local_490,local_4c8._52_4_);
        Dialog::add(&this->d,(Widget *)(&this->field_0x920 + lVar13),iVar6,0x23,5,1);
        Dialog::add(&this->d,(Widget *)(&this->field_0x9e0 + lVar13),iVar6,0x24,5,1);
        Dialog::add(&this->d,(Widget *)(&this->field_0xaa0 + lVar13),iVar6,0x25,5,1);
        Dialog::add(&this->d,(Widget *)((long)&this[1].d.theme + lVar13),iVar6,0x26,5,1);
        iVar6 = iVar6 + 6;
        lVar13 = lVar13 + 0x40;
      } while (lVar13 != 0);
      return;
    }
  } while( true );
}

Assistant:

Prog::Prog(const Theme & theme, ALLEGRO_DISPLAY *display) :
   d(Dialog(theme, display, 20, 40)),
   memory_label(Label("Memory")),
   texture_label(Label("Texture")),
   source_label(Label("Source", false)),
   destination_label(Label("Destination", false)),
   source_image(List(0)),
   destination_image(List(1)),
   draw_mode(List(0))
{
   d.add(memory_label, 9, 0, 10, 2);
   d.add(texture_label, 0, 0, 10, 2);
   d.add(source_label, 1, 15, 6, 2);
   d.add(destination_label, 7, 15, 6, 2);

   List *images[] = {&source_image, &destination_image, &draw_mode};
   for (int i = 0; i < 3; i++) {
      List & image = *images[i];
      if (i < 2) {
         image.append_item("Mysha");
         image.append_item("Allegro");
         image.append_item("Mysha (tinted)");
         image.append_item("Allegro (tinted)");
         image.append_item("Color");
      }
      else {
         image.append_item("original");
         image.append_item("scaled");
         image.append_item("rotated");
      }
      d.add(image, 1 + i * 6, 16, 4, 6);
   }

   for (int i = 0; i < 4; i++) {
      operation_label[i] = Label(i % 2 == 0 ? "Color" : "Alpha", false);
      d.add(operation_label[i], 1 + i * 3, 23, 3, 2);
      List &l = operations[i];
      l.append_item("ONE");
      l.append_item("ZERO");
      l.append_item("ALPHA");
      l.append_item("INVERSE");
      l.append_item("SRC_COLOR");
      l.append_item("DEST_COLOR");
      l.append_item("INV_SRC_COLOR");
      l.append_item("INV_DEST_COLOR");
      l.append_item("CONST_COLOR");
      l.append_item("INV_CONST_COLOR");
      d.add(l, 1 + i * 3, 24, 3, 10);
   }

   for (int i = 4; i < 6; i++) {
      operation_label[i] = Label(i == 4 ? "Blend op" : "Alpha op", false);
      d.add(operation_label[i], 1 + i * 3, 23, 3, 2);
      List &l = operations[i];
      l.append_item("ADD");
      l.append_item("SRC_MINUS_DEST");
      l.append_item("DEST_MINUS_SRC");
      d.add(l, 1 + i * 3, 24, 3, 6);
   }

   rgba_label[0] = Label("Source tint/color RGBA");
   rgba_label[1] = Label("Dest tint/color RGBA");
   rgba_label[2] = Label("Const color RGBA");
   d.add(rgba_label[0], 1, 34, 5, 1);
   d.add(rgba_label[1], 7, 34, 5, 1);
   d.add(rgba_label[2], 13, 34, 5, 1);

   for (int i = 0; i < 3; i++) {
      r[i] = HSlider(255, 255);
      g[i] = HSlider(255, 255);
      b[i] = HSlider(255, 255);
      a[i] = HSlider(255, 255);
      d.add(r[i], 1 + i * 6, 35, 5, 1);
      d.add(g[i], 1 + i * 6, 36, 5, 1);
      d.add(b[i], 1 + i * 6, 37, 5, 1);
      d.add(a[i], 1 + i * 6, 38, 5, 1);
   }
}